

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O1

bool __thiscall argvParser::analyzeConfigFile(argvParser *this,string *fileName)

{
  size_type *psVar1;
  pointer pcVar2;
  long lVar3;
  undefined8 this_00;
  bool bVar4;
  bool bVar5;
  configFileReader *this_01;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_02;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  _Alloc_hider _Stack_a0;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  string param;
  
  _Stack_a0._M_p = (pointer)0x106f23;
  this_01 = (configFileReader *)operator_new(0x80);
  pcVar2 = (fileName->_M_dataplus)._M_p;
  _Stack_a0._M_p = (pointer)0x106f41;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + fileName->_M_string_length);
  _Stack_a0._M_p = (pointer)0x106f4d;
  configFileReader::configFileReader(this_01,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    _Stack_a0._M_p = (pointer)0x106f5b;
    operator_delete(local_78._M_dataplus._M_p);
  }
  pcVar2 = (this->commentToken)._M_dataplus._M_p;
  _Stack_a0._M_p = (pointer)0x106f83;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (this->commentToken)._M_string_length);
  _Stack_a0._M_p = (pointer)0x106f8e;
  configFileReader::setCommentChar(this_01,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    _Stack_a0._M_p = (pointer)0x106f9f;
    operator_delete(local_98._M_dataplus._M_p);
  }
  _Stack_a0._M_p = (pointer)0x106fa7;
  bVar4 = configFileReader::isEOF(this_01);
  if (bVar4) {
    pcVar2 = (this_01->commentToken)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this_01->commentToken).field_2) {
      _Stack_a0._M_p = (pointer)0x106fc0;
      operator_delete(pcVar2);
    }
    pcVar2 = (this_01->text)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this_01->text).field_2) {
      _Stack_a0._M_p = (pointer)0x106fd2;
      operator_delete(pcVar2);
    }
    pcVar2 = (this_01->fileName)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this_01->fileName).field_2) {
      _Stack_a0._M_p = (pointer)0x106fe6;
      operator_delete(pcVar2);
    }
    _Stack_a0._M_p = (pointer)0x106fee;
    operator_delete(this_01);
  }
  else {
    _Stack_a0._M_p = (pointer)0x106ffd;
    this_02 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              operator_new(0x18);
    *(undefined8 *)this_02 = 0;
    *(undefined8 *)(this_02 + 8) = 0;
    *(undefined8 *)(this_02 + 0x10) = 0;
    psVar1 = &param._M_string_length;
    _Stack_a0._M_p = (pointer)0x10702d;
    local_58 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"program Name","");
    _Stack_a0._M_p = (pointer)0x107039;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (this_02,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58
              );
    param.field_2._8_8_ = this;
    if (local_58 != (undefined1  [8])psVar1) {
      _Stack_a0._M_p = (pointer)0x10704b;
      operator_delete((void *)local_58);
    }
    _Stack_a0._M_p = (pointer)0x107053;
    bVar5 = configFileReader::isEOF(this_01);
    if (!bVar5) {
      do {
        _Stack_a0._M_p = (pointer)0x107066;
        configFileReader::readUntilNextSeparator_abi_cxx11_((string *)local_58,this_01);
        _Stack_a0._M_p = (pointer)0x107071;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_02,(string *)local_58);
        if (local_58 != (undefined1  [8])psVar1) {
          _Stack_a0._M_p = (pointer)0x10707f;
          operator_delete((void *)local_58);
        }
        _Stack_a0._M_p = (pointer)0x107087;
        bVar5 = configFileReader::isEOF(this_01);
      } while (!bVar5);
    }
    lVar3 = -((*(long *)(this_02 + 8) - *(long *)this_02 >> 2) + 0xfU & 0xfffffffffffffff0);
    puVar6 = *(undefined8 **)this_02;
    lVar7 = (long)*(undefined8 **)(this_02 + 8) - (long)puVar6 >> 5;
    if (*(undefined8 **)(this_02 + 8) != puVar6) {
      lVar8 = 0;
      do {
        ((char **)((long)&local_98 + lVar3))[lVar8] = (char *)*puVar6;
        lVar8 = lVar8 + 1;
        puVar6 = puVar6 + 4;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar8);
    }
    this_00 = param.field_2._8_8_;
    *(undefined8 *)((long)&_Stack_a0 + lVar3) = 0x1070ed;
    analyseArgv((argvParser *)this_00,(int)lVar7,(char **)((long)&local_98 + lVar3));
    pcVar2 = (this_01->commentToken)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this_01->commentToken).field_2) {
      *(undefined8 *)((long)&_Stack_a0 + lVar3) = 0x1070ff;
      operator_delete(pcVar2);
    }
    pcVar2 = (this_01->text)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this_01->text).field_2) {
      *(undefined8 *)((long)&_Stack_a0 + lVar3) = 0x107111;
      operator_delete(pcVar2);
    }
    pcVar2 = (this_01->fileName)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(this_01->fileName).field_2) {
      *(undefined8 *)((long)&_Stack_a0 + lVar3) = 0x107125;
      operator_delete(pcVar2);
    }
    *(undefined8 *)((long)&_Stack_a0 + lVar3) = 0x10712d;
    operator_delete(this_01);
  }
  return !bVar4;
}

Assistant:

bool argvParser::analyzeConfigFile(string fileName) {
    configFileReader *reader = new configFileReader(fileName);
    reader->setCommentChar(commentToken);
    if (!reader->isEOF()) {
        vector<string> *arg = new vector<string>();
        arg->push_back("program Name");
        while (!reader->isEOF()) {
            string param = reader->readUntilNextSeparator();
            arg->push_back(param);
        }
        char *buff[arg->size()];
        for (int y = 0; y < arg->size(); y++) {
            buff[y] = const_cast<char *>(arg->at(y).c_str());
        }
        analyseArgv(arg->size(), buff);
        delete reader;
    } else {
        delete reader;
        return false;
    }
    return true;
}